

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O3

void __thiscall chrono::utils::ChChaseCamera::Zoom(ChChaseCamera *this,int val)

{
  State SVar1;
  double dVar2;
  
  if (val == 0) {
    return;
  }
  SVar1 = this->m_state;
  if (Follow < SVar1) {
    if (SVar1 == Free) {
      if (val < 0) {
        dVar2 = this->m_mult + 0.01;
      }
      else {
        dVar2 = this->m_mult + -0.01;
      }
      this->m_mult = dVar2;
      return;
    }
    if (SVar1 != Inside) {
      return;
    }
    if (val < 1) {
      return;
    }
    dVar2 = (this->m_loc).m_data[1];
    (this->m_lastLoc).m_data[0] = (this->m_loc).m_data[0];
    (this->m_lastLoc).m_data[1] = dVar2;
    (this->m_lastLoc).m_data[2] = (this->m_loc).m_data[2];
    this->m_state = Chase;
    this->m_angle = 0.0;
    return;
  }
  dVar2 = this->m_mult;
  if (val < 0) {
    if (dVar2 <= this->m_minMult) goto LAB_00921b3d;
    dVar2 = dVar2 / 1.01;
  }
  else {
    if (this->m_maxMult <= dVar2) goto LAB_00921b3d;
    dVar2 = dVar2 * 1.01;
  }
  this->m_mult = dVar2;
LAB_00921b3d:
  if (this->m_minMult < dVar2) {
    return;
  }
  dVar2 = (this->m_loc).m_data[1];
  (this->m_lastLoc).m_data[0] = (this->m_loc).m_data[0];
  (this->m_lastLoc).m_data[1] = dVar2;
  (this->m_lastLoc).m_data[2] = (this->m_loc).m_data[2];
  this->m_state = Inside;
  return;
}

Assistant:

void ChChaseCamera::Zoom(int val) {
    if (val == 0 || m_state == Track)
        return;

    if (m_state == Inside) {
        if (val > 0)
            SetState(Chase);
        return;
    }
        
    if (m_state == Chase || m_state == Follow) {
        if (val < 0 && m_mult > m_minMult)
            m_mult /= 1.01;
        else if (val > 0 && m_mult < m_maxMult)
            m_mult *= 1.01;

        if (m_mult <= m_minMult)
            SetState(Inside);
    }

    if (m_state == Free) {
        if (val < 0)
            m_mult += 0.01;
        else
            m_mult -= 0.01;
    }

}